

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O1

int adios2::utils::readVar<std::complex<float>>
              (Engine *fp,IO *io,Variable<std::complex<float>_> *variable)

{
  undefined1 auVar1 [16];
  pointer puVar2;
  byte bVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  size_type __new_size;
  ostream *poVar10;
  ulong uVar11;
  pointer *ppuVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  pointer *ppuVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  Variable<std::complex<float>_> *in_R8;
  ulong uVar20;
  size_t relstep;
  long lVar21;
  long lVar22;
  ulong uVar23;
  Dims dimsign;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> dataV;
  uint64_t c [16];
  uint64_t s [16];
  uint64_t readn [16];
  uint64_t count_t [16];
  uint64_t start_t [16];
  int ndigits_dims [32];
  ulong local_448;
  int local_430;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_428;
  ulong *local_3f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3e8;
  Engine *local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_398;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> local_378;
  long local_360;
  string *local_358;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_350;
  pointer local_338 [16];
  pointer *local_2b8 [16];
  ulong auStack_238 [16];
  ulong local_1b8 [16];
  size_t local_138 [16];
  int local_b8 [34];
  
  local_378.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f0 = *(ulong **)(variable + 0x30);
  uVar6 = 1;
  local_3d0 = fp;
  if (timestep == 0) {
    uVar6 = adios2::core::VariableBase::GetAvailableStepsCount();
  }
  lVar22 = *(long *)(variable + 0x60);
  lVar21 = *(long *)(variable + 0x58);
  bVar3 = (int)uVar6 < 2 | timestep;
  if (bVar3 == 0) {
    relstep = (ulong)((uint)(istart >> 0x3f) & uVar6) + istart;
    local_448 = ((uVar6 + icount) - relstep) + 1;
    if (-1 < (long)icount) {
      local_448 = icount;
    }
    if (2 < verbose) {
      printf("    j=0, stepStart=%lu stepCount=%lu\n",relstep,local_448);
    }
    if ((ulong)uVar6 < local_448 + relstep) {
      printf("ERROR: The sum of start step (%lu) and step count (%lu) is larger than the number of steps available (%d)\n"
             ,relstep,local_448,(ulong)uVar6);
      iVar7 = -1;
      goto LAB_001518b9;
    }
    local_430 = 1;
    local_1b8[0] = local_448;
    local_138[0] = relstep;
    if (1 < verbose) {
      printf("    s[0]=%lu, c[0]=%lu, n=%lu\n",relstep,local_448,local_448);
    }
  }
  else {
    relstep = 0;
    local_448 = 1;
    local_430 = 0;
  }
  sVar8 = relative_to_absolute_step<std::complex<float>>(local_3d0,variable,relstep);
  local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (timestep == 1) {
    adios2::core::VariableBase::Shape((ulong)&local_428);
  }
  else {
    adios2::core::VariableBase::Shape((ulong)&local_428);
  }
  puVar2 = local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  if ((pointer *)
      local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_428.first.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar15 = (ulong)(lVar22 - lVar21) >> 3;
  if (2 < verbose) {
    printf("    starting step=%lu absolute step=%zu, dims={",relstep,sVar8);
    puVar2 = local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppuVar16 = (pointer *)
                    local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppuVar16 != (pointer *)puVar2;
        ppuVar16 = ppuVar16 + 1) {
      printf("%zu",*ppuVar16);
    }
    puts("}");
  }
  uVar14 = (uint)uVar15;
  if (bVar3 == 0) {
    get_global_array_signature<std::complex<float>>
              (&local_428.first,(utils *)local_3d0,(Engine *)io,(IO *)variable,in_R8);
    ppuVar16 = (pointer *)
               local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar4 = false;
    }
    else {
      do {
        ppuVar12 = ppuVar16 + 1;
        bVar4 = false;
        if (*ppuVar16 == (pointer)0x0) {
          bVar4 = true;
          break;
        }
        ppuVar16 = ppuVar12;
      } while (ppuVar12 !=
               (pointer *)
               local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    if ((!bVar4) || (local_448 < 2)) {
      if ((pointer *)
          local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_428.first.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_0015103f;
    }
    puts(
        "ERROR: This variable has a changing shape over time, so bpls cannot dump it as a global array. "
        );
    printf("You can dump a single step with\n    bpls -d %s -s \"T",*(undefined8 *)(variable + 8));
    if (0 < (int)uVar14) {
      uVar17 = uVar15 & 0xffffffff;
      do {
        printf(",0");
        uVar13 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar13;
      } while (uVar13 != 0);
    }
    printf("\" -c \"1");
    if (0 < (int)uVar14) {
      do {
        printf(",-1");
        uVar14 = (int)uVar15 - 1;
        uVar15 = (ulong)uVar14;
      } while (uVar14 != 0);
    }
    printf("\"\nwhere T is a number between 0 and %d,\n",(ulong)(uVar6 - 1));
    printf("or dump each block separately with \n    bpls -dD %s\n",*(undefined8 *)(variable + 8));
    if ((pointer *)
        local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer *)0x0) {
      operator_delete(local_428.first.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    iVar7 = -1;
  }
  else {
LAB_0015103f:
    if (0 < (int)uVar14) {
      uVar17 = (ulong)(uint)(local_430 * 8);
      local_3c8 = (long)local_1b8 + uVar17;
      uVar15 = 0;
      do {
        lVar22 = uVar17 + uVar15 * 8;
        lVar21 = *(long *)((long)&istart + lVar22);
        if (lVar21 < 0) {
          lVar21 = lVar21 + (long)local_3e8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar15];
        }
        lVar22 = *(long *)((long)&icount + lVar22);
        if (lVar22 < 0) {
          lVar22 = (long)local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar15] + (lVar22 - lVar21) + 1;
        }
        if (2 < verbose) {
          printf("    j=%d, st=%lu ct=%lu\n",(ulong)(uint)(local_430 + (int)uVar15),lVar21,lVar22);
        }
        *(long *)((long)local_138 + uVar15 * 8 + uVar17) = lVar21;
        *(long *)(local_3c8 + uVar15 * 8) = lVar22;
        local_448 = local_448 * lVar22;
        if (1 < verbose) {
          uVar6 = local_430 + (int)uVar15;
          printf("    s[%d]=%lu, c[%d]=%lu, n=%lu\n",(ulong)uVar6,lVar21,(ulong)uVar6,lVar22,
                 local_448);
        }
        uVar15 = uVar15 + 1;
      } while ((uVar14 & 0x7fffffff) != uVar15);
    }
    if (1 < verbose) {
      printf(" total size of data to read = %lu\n",local_448 * (long)local_3f0);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_350,&local_3e8);
    print_slice_info((VariableBase *)variable,(bool)(bVar3 ^ 1),local_138,local_1b8,&local_350);
    if (local_350.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_350.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_3f0;
    uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xa00000)) / auVar1,0);
    if (local_448 < uVar15) {
      uVar15 = local_448;
    }
    ppuVar16 = &local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,".xml","");
    local_358 = (string *)(variable + 8);
    cVar5 = adios2::helper::EndsWith(local_358,(string *)&local_428,false);
    if ((pointer *)
        local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar16) {
      operator_delete(local_428.first.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    uVar6 = uVar14 + local_430;
    uVar17 = (ulong)uVar6;
    if (cVar5 != '\0') {
      uVar15 = local_448;
    }
    if (1 < verbose) {
      puts("Read size strategy:");
    }
    uVar23 = (ulong)(uVar6 - 1);
    local_3c0 = uVar23;
    if ((int)uVar6 < 1) {
      lVar22 = 1;
      uVar20 = 1;
    }
    else {
      uVar20 = 1;
      lVar22 = 1;
      uVar18 = uVar17;
      do {
        if (uVar20 < uVar15) {
          uVar9 = uVar15 / (ulong)(long)(int)uVar20;
          uVar11 = local_1b8[uVar23];
          if (uVar9 < local_1b8[uVar23]) {
            uVar11 = uVar9;
          }
          auStack_238[uVar23] = uVar11;
        }
        else {
          auStack_238[uVar23] = 1;
        }
        if (1 < verbose) {
          printf("    dim %d: read %lu elements\n",uVar23 & 0xffffffff,auStack_238[uVar23]);
        }
        uVar20 = uVar20 * local_1b8[uVar23];
        lVar22 = lVar22 * auStack_238[uVar23];
        uVar23 = uVar23 - 1;
        iVar7 = (int)uVar18;
        uVar13 = iVar7 - 1;
        uVar18 = (ulong)uVar13;
      } while (uVar13 != 0 && 0 < iVar7);
    }
    if (1 < verbose) {
      printf("    read %lu elements at once, %lu in total (nelems=%lu)\n",lVar22,uVar20,local_448);
    }
    if (0 < (int)uVar6) {
      uVar15 = 0;
      do {
        local_2b8[uVar15] = (pointer *)local_138[uVar15];
        local_338[uVar15] = (pointer)auStack_238[uVar15];
        iVar7 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",
                         (long)local_138[uVar15] + (local_1b8[uVar15] - 1));
        local_b8[uVar15] = iVar7;
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
    }
    if (local_448 != 0) {
      local_3f0 = (ulong *)(long)(int)uVar14;
      local_360 = (long)local_338 + (ulong)(uint)(local_430 << 3);
      local_3c0 = local_3c0 << 3;
      uVar15 = 0;
      do {
        if ((int)uVar6 < 1) {
          lVar22 = 1;
        }
        else {
          lVar22 = 1;
          uVar23 = 0;
          do {
            lVar22 = lVar22 * (long)local_338[uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar17 != uVar23);
        }
        local_3c8 = uVar15;
        if (2 < verbose) {
          printf("adios_read_var name=%s ",*(undefined8 *)local_358);
          printf("%s = { ","  start");
          if (0 < (int)uVar6) {
            uVar15 = 0;
            do {
              printf("%lu ",local_2b8[uVar15]);
              uVar15 = uVar15 + 1;
            } while (uVar17 != uVar15);
          }
          putchar(0x7d);
          printf("%s = { ","  count");
          if (0 < (int)uVar6) {
            uVar15 = 0;
            do {
              printf("%lu ",local_338[uVar15]);
              uVar15 = uVar15 + 1;
            } while (uVar17 != uVar15);
          }
          putchar(0x7d);
          printf("  read %lu elems\n",lVar22);
        }
        if (*(int *)(variable + 0x40) == 2) {
          adios2::helper::Uint64ArrayToSizetVector((ulong)&local_398,local_3f0);
        }
        else {
          local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        if (*(int *)(variable + 0x40) == 2) {
          adios2::helper::Uint64ArrayToSizetVector((ulong)&local_3b8,local_3f0);
        }
        else {
          local_3b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_3b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        }
        if (2 < verbose) {
          printf("set selection: ");
          printf("%s = { ","  start");
          if (0 < (int)uVar14) {
            uVar15 = 0;
            do {
              printf("%zu ",local_398.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar15]);
              uVar15 = uVar15 + 1;
            } while ((uVar14 & 0x7fffffff) != uVar15);
          }
          putchar(0x7d);
          printf("%s = { ","  count");
          if (0 < (int)uVar14) {
            uVar15 = 0;
            do {
              printf("%zu ",local_3b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar15]);
              uVar15 = uVar15 + 1;
            } while ((uVar14 & 0x7fffffff) != uVar15);
          }
          putchar(0x7d);
          putchar(10);
        }
        if (*(int *)(variable + 0x40) == 2) {
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                    (&local_428,&local_398,&local_3b8);
          adios2::core::VariableBase::SetSelection((pair *)variable);
          if (local_428.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_428.second.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((pointer *)
              local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
            operator_delete(local_428.first.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (bVar3 == 0) {
          if (2 < verbose) {
            printf("set Step selection: from relative step %lu read %lu steps\n",local_2b8[0],
                   local_338[0]);
          }
          local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_2b8[0];
          local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = local_338[0];
          adios2::core::VariableBase::SetStepSelection((pair *)variable);
        }
        __new_size = adios2::core::Variable<std::complex<float>>::SelectionSize();
        std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
                  (&local_378,__new_size);
        adios2::core::Engine::Get<std::complex<float>>
                  ((Variable *)local_3d0,variable,(Mode)&local_378);
        print_dataset(local_378.
                      super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,*(DataType *)(variable + 0x28),
                      (uint64_t *)local_2b8,(uint64_t *)local_338,uVar6,local_b8);
        if (0 < (int)uVar6) {
          bVar4 = true;
          uVar15 = local_3c0;
          uVar23 = uVar17;
          do {
            if (bVar4) {
              uVar20 = *(long *)((long)local_1b8 + uVar15) + *(long *)((long)local_138 + uVar15);
              if (*(long *)((long)local_338 + uVar15) + *(long *)((long)local_2b8 + uVar15) ==
                  uVar20) {
                *(long *)((long)local_2b8 + uVar15) = *(long *)((long)local_138 + uVar15);
                lVar21 = *(long *)((long)auStack_238 + uVar15);
                bVar4 = true;
              }
              else {
                lVar21 = *(long *)((long)local_2b8 + uVar15) + *(long *)((long)auStack_238 + uVar15)
                ;
                *(long *)((long)local_2b8 + uVar15) = lVar21;
                if ((ulong)(*(long *)((long)local_338 + uVar15) + lVar21) <= uVar20) {
                  bVar4 = false;
                  goto LAB_00151788;
                }
                lVar21 = uVar20 - lVar21;
                bVar4 = false;
              }
              *(long *)((long)local_338 + uVar15) = lVar21;
            }
LAB_00151788:
            uVar15 = uVar15 - 8;
            iVar7 = (int)uVar23;
            uVar13 = iVar7 - 1;
            uVar23 = (ulong)uVar13;
          } while (uVar13 != 0 && 0 < iVar7);
        }
        if (local_3b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3b8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar15 = local_3c8;
        if (local_398.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_398.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar15 = uVar15 + lVar22;
      } while (uVar15 < local_448);
    }
    if (nextcol != 0) {
      fputc(10,outf);
    }
    nextcol = 0;
    iVar7 = 0;
    if (accuracyWasSet == '\x01') {
      adios2::core::VariableBase::GetAccuracy();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Read accuracy was (error = ",0x1b);
      poVar10 = std::ostream::_M_insert<double>
                          ((double)local_428.first.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", norm = ",9);
      poVar10 = std::ostream::_M_insert<double>
                          ((double)local_428.first.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      pcVar19 = "abs";
      if ((char)local_428.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage != '\0') {
        pcVar19 = "rel";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar19,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,")\n",2);
      iVar7 = 0;
    }
  }
  if ((pointer *)
      local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_3e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_001518b9:
  if (local_378.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_378.
                    super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar7;
}

Assistant:

int readVar(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    int i, j;
    uint64_t start_t[MAX_DIMS],
        count_t[MAX_DIMS]; // processed <0 values in start/count
    uint64_t s[MAX_DIMS],
        c[MAX_DIMS]; // for block reading of smaller chunks
    int tdims;       // number of dimensions including time
    int tidx;        // 0 or 1 to account for time dimension
    uint64_t nelems; // number of elements to read
    // size_t elemsize;                   // size in bytes of one element
    uint64_t stepStart, stepCount;
    std::vector<T> dataV;
    uint64_t sum;             // working var to sum up things
    uint64_t maxreadn;        // max number of elements to read once up to a limit
                              // (10MB of data)
    uint64_t actualreadn;     // our decision how much to read at once
    uint64_t readn[MAX_DIMS]; // how big chunk to read in in each dimension?
    int ndigits_dims[32];     // # of digits (to print) of each dimension

    const size_t elemsize = variable->m_ElementSize;
    const int nsteps = (timestep ? 1 : static_cast<int>(variable->GetAvailableStepsCount()));
    const int ndim = static_cast<int>(variable->m_Shape.size());
    // create the counter arrays with the appropriate lengths
    // transfer start and count arrays to format dependent arrays

    nelems = 1;
    tidx = 0;
    stepStart = 0;
    stepCount = 1;

    if (!timestep && nsteps > 1)
    {
        // user selection must start with step selection
        // calculate the starting step and number of steps requested
        if (istart[0] < 0) // negative index means last-|index|
            stepStart = nsteps + istart[0];
        else
            stepStart = istart[0];
        if (icount[0] < 0) // negative index means last-|index|+1-start
            stepCount = nsteps + icount[0] + 1 - stepStart;
        else
            stepCount = icount[0];

        if (verbose > 2)
            printf("    j=0, stepStart=%" PRIu64 " stepCount=%" PRIu64 "\n", stepStart, stepCount);

        if (stepStart + stepCount > static_cast<uint64_t>(nsteps))
        {
            printf("ERROR: The sum of start step (%" PRIu64 ") and step count (%" PRIu64
                   ") is larger "
                   "than the number of steps available (%d)\n",
                   stepStart, stepCount, nsteps);
            return -1;
        }

        start_t[0] = stepStart;
        count_t[0] = stepCount;
        nelems *= stepCount;
        if (verbose > 1)
            printf("    s[0]=%" PRIu64 ", c[0]=%" PRIu64 ", n=%" PRIu64 "\n", start_t[0],
                   count_t[0], nelems);
        tidx = 1;
    }

    tdims = ndim + tidx;

    // Absolute step is needed to access Shape of variable in a step
    // and also for StepSelection
    size_t absstep = relative_to_absolute_step(fp, variable, stepStart);

    // Get the shape of the variable for the starting step
    Dims shape;
    if (timestep)
    {
        shape = variable->Shape();
    }
    else
    {
        shape = variable->Shape(absstep);
    }
    if (verbose > 2)
    {
        printf("    starting step=%" PRIu64 " absolute step=%zu"
               ", dims={",
               stepStart, absstep);
        for (auto dim : shape)
        {
            printf("%zu", dim);
        }
        printf("}\n");
    }

    if (tidx)
    {
        // If shape is changing we still can support printing a single step
        auto dimsign = get_global_array_signature(fp, io, variable);
        bool changingShape = false;
        for (auto d : dimsign)
        {
            if (d == 0)
            {
                changingShape = true;
                break;
            }
        }
        if (changingShape && stepCount > 1)
        {
            printf("ERROR: This variable has a changing shape over time, "
                   "so bpls cannot dump it as a global array. \n");
            printf("You can dump a single step with\n"
                   "    bpls -d %s -s \"T",
                   variable->m_Name.c_str());
            for (j = 0; j < ndim; j++)
            {
                printf(",0");
            }
            printf("\" -c \"1");
            for (j = 0; j < ndim; j++)
            {
                printf(",-1");
            }
            printf("\"\nwhere T is a number between 0 and %d,\n", nsteps - 1);
            printf("or dump each block separately with \n"
                   "    bpls -dD %s\n",
                   variable->m_Name.c_str());
            return -1;
        }
    }

    for (j = 0; j < ndim; j++)
    {
        uint64_t st, ct;
        if (istart[j + tidx] < 0) // negative index means last-|index|
            st = shape[j] + istart[j + tidx];
        else
            st = istart[j + tidx];
        if (icount[j + tidx] < 0) // negative index means last-|index|+1-start
            ct = shape[j] + icount[j + tidx] + 1 - st;
        else
            ct = icount[j + tidx];

        if (verbose > 2)
            printf("    j=%d, st=%" PRIu64 " ct=%" PRIu64 "\n", j + tidx, st, ct);

        start_t[j + tidx] = st;
        count_t[j + tidx] = ct;
        nelems *= ct;
        if (verbose > 1)
            printf("    s[%d]=%" PRIu64 ", c[%d]=%" PRIu64 ", n=%" PRIu64 "\n", j + tidx,
                   start_t[j + tidx], j + tidx, count_t[j + tidx], nelems);
    }

    if (verbose > 1)
    {
        printf(" total size of data to read = %" PRIu64 "\n", nelems * elemsize);
    }

    print_slice_info(variable, (tidx == 1), start_t, count_t, shape);

    maxreadn = (uint64_t)MAX_BUFFERSIZE / elemsize;
    if (nelems < maxreadn)
        maxreadn = nelems;

    bool xmlprint = helper::EndsWith(variable->m_Name, ".xml", false);
    if (xmlprint && nelems > maxreadn)
        maxreadn = nelems;

    // special case: string. Need to use different elemsize
    /*if (vi->type == DataType::String)
    {
        if (vi->value)
            elemsize = strlen(vi->value) + 1;
        maxreadn = elemsize;
    }*/

    // allocate data array
    // data = (T *)malloc(maxreadn * elemsize);

    // determine strategy how to read in:
    //  - at once
    //  - loop over 1st dimension
    //  - loop over 1st & 2nd dimension
    //  - etc
    if (verbose > 1)
        printf("Read size strategy:\n");
    sum = (uint64_t)1;
    actualreadn = (uint64_t)1;
    for (i = tdims - 1; i >= 0; i--)
    {
        if (sum >= (uint64_t)maxreadn)
        {
            readn[i] = 1;
        }
        else
        {
            readn[i] = maxreadn / (int)sum; // sum is small for 4 bytes here
            // this may be over the max count for this dimension
            if (readn[i] > count_t[i])
                readn[i] = count_t[i];
        }
        if (verbose > 1)
            printf("    dim %d: read %" PRIu64 " elements\n", i, readn[i]);
        sum = sum * (uint64_t)count_t[i];
        actualreadn = actualreadn * readn[i];
    }
    if (verbose > 1)
        printf("    read %" PRIu64 " elements at once, %" PRIu64 " in total (nelems=%" PRIu64 ")\n",
               actualreadn, sum, nelems);

    // init s and c
    // and calculate ndigits_dims
    for (j = 0; j < tdims; j++)
    {
        s[j] = start_t[j];
        c[j] = readn[j];

        ndigits_dims[j] =
            ndigits(start_t[j] + count_t[j] - 1); // -1: dim=100 results in 2 digits (0..99)
    }

    // read until read all 'nelems' elements
    sum = 0;
    while (sum < nelems)
    {

        // how many elements do we read in next?
        actualreadn = 1;
        for (j = 0; j < tdims; j++)
            actualreadn *= c[j];

        if (verbose > 2)
        {
            printf("adios_read_var name=%s ", variable->m_Name.c_str());
            PRINT_DIMS_UINT64("  start", s, tdims, j);
            PRINT_DIMS_UINT64("  count", c, tdims, j);
            printf("  read %" PRIu64 " elems\n", actualreadn);
        }

        // read a slice finally
        const Dims startv = variable->m_ShapeID == ShapeID::GlobalArray
                                ? helper::Uint64ArrayToSizetVector(tdims - tidx, s + tidx)
                                : Dims();
        const Dims countv = variable->m_ShapeID == ShapeID::GlobalArray
                                ? helper::Uint64ArrayToSizetVector(tdims - tidx, c + tidx)
                                : Dims();

        if (verbose > 2)
        {
            printf("set selection: ");
            PRINT_DIMS_SIZET("  start", startv.data(), tdims - tidx, j);
            PRINT_DIMS_SIZET("  count", countv.data(), tdims - tidx, j);
            printf("\n");
        }

        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            variable->SetSelection({startv, countv});
        }

        if (tidx)
        {
            if (verbose > 2)
            {
                printf("set Step selection: from relative step %" PRIu64 " read %" PRIu64
                       " steps\n",
                       s[0], c[0]);
            }
            variable->SetStepSelection({s[0], c[0]});
        }

        dataV.resize(variable->SelectionSize());
        fp->Get(*variable, dataV, adios2::Mode::Sync);

        // print slice
        print_dataset(dataV.data(), variable->m_Type, s, c, tdims, ndigits_dims);

        // prepare for next read
        sum += actualreadn;
        bool incdim = true; // last dim should be increased
        for (j = tdims - 1; j >= 0; j--)
        {
            if (incdim)
            {
                if (s[j] + c[j] == start_t[j] + count_t[j])
                {
                    // reached the end of this dimension
                    s[j] = start_t[j];
                    c[j] = readn[j];
                    incdim = true; // previous dim can increase too
                }
                else
                {
                    // move up in this dimension up to total count
                    s[j] += readn[j];
                    if (s[j] + c[j] > start_t[j] + count_t[j])
                    {
                        // do not reach over the limit
                        c[j] = start_t[j] + count_t[j] - s[j];
                    }
                    incdim = false;
                }
            }
        }
    } // end while sum < nelems
    print_endline();

    if (accuracyWasSet)
    {
        adios2::Accuracy a = variable->GetAccuracy();
        std::cout << "Read accuracy was (error = " << a.error << ", norm = " << a.norm << ", "
                  << (a.relative ? "rel" : "abs") << ")\n";
    }

    return 0;
}